

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-common.cpp
# Opt level: O1

void test_common<long>(uint length,long value)

{
  bool bVar1;
  undefined8 uVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  uint i;
  int iVar5;
  long lVar6;
  ulong uVar7;
  undefined1 (*pauVar8) [16];
  undefined8 *puVar9;
  int iVar10;
  undefined1 (*pauVar11) [16];
  int iVar12;
  int iVar13;
  undefined4 in_register_0000003c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var14;
  size_t __size;
  ulong uVar15;
  uint uVar16;
  undefined1 auVar17 [16];
  undefined1 (*local_70) [16];
  undefined1 (*local_68) [16];
  shared_ptr<long> pa;
  undefined1 (*local_48) [16];
  shared_ptr<long> pb;
  
  pb.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(in_register_0000003c,length);
  __size = (long)(int)(length + 1) << 3;
  iVar5 = posix_memalign(&local_48,0x10,__size);
  local_68 = (undefined1 (*) [16])0x0;
  if (iVar5 == 0) {
    local_68 = local_48;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<long*,void(*)(long*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pa,local_68,sse::common::free<long>);
  iVar5 = posix_memalign(&local_70,0x10,__size);
  local_48 = (undefined1 (*) [16])0x0;
  if (iVar5 == 0) {
    local_48 = local_70;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<long*,void(*)(long*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pb,local_48,sse::common::free<long>);
  pauVar4 = local_48;
  pauVar3 = local_68;
  iVar13 = (int)pb.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  uVar15 = (ulong)pb.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi &
           0xffffffff;
  *(undefined8 *)(*local_68 + uVar15 * 8) = 0x7f;
  *(undefined8 *)(*local_48 + uVar15 * 8) = 0x3f;
  auVar17._8_4_ = (int)value;
  auVar17._0_8_ = value;
  auVar17._12_4_ = (int)((ulong)value >> 0x20);
  iVar12 = iVar13 >> 1;
  pauVar8 = local_68;
  iVar10 = iVar12;
  iVar5 = iVar12;
  if (3 < iVar12) {
    do {
      *pauVar8 = auVar17;
      pauVar8[1] = auVar17;
      pauVar8[2] = auVar17;
      pauVar8[3] = auVar17;
      iVar5 = iVar10 + -4;
      pauVar8 = pauVar8 + 4;
      bVar1 = 7 < iVar10;
      iVar10 = iVar5;
    } while (bVar1);
  }
  if (1 < iVar5) {
    *pauVar8 = auVar17;
    pauVar8[1] = auVar17;
    iVar5 = iVar5 + -2;
    pauVar8 = pauVar8 + 2;
  }
  if (iVar5 != 0) {
    *pauVar8 = auVar17;
  }
  _Var14._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(long)iVar13;
  if (iVar13 != 0) {
    *(long *)(local_68[-1] + (long)_Var14._M_pi * 8 + 8) = value;
    lVar6 = 0;
    do {
      if (*(long *)(*local_68 + lVar6 * 8) != value) {
        puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar9 = "void test_common(unsigned int, T) [T = long]";
        *(undefined4 *)(puVar9 + 1) = 0x16;
        *(int *)((long)puVar9 + 0xc) = iVar13;
        __cxa_throw(puVar9,&Exception::typeinfo,0);
      }
      lVar6 = lVar6 + 1;
    } while (iVar13 != (int)lVar6);
  }
  pauVar8 = local_48;
  pauVar11 = local_68;
  iVar10 = iVar12;
  iVar5 = iVar12;
  if (3 < iVar12) {
    do {
      uVar2 = *(undefined8 *)(*pauVar11 + 8);
      *(undefined8 *)*pauVar8 = *(undefined8 *)*pauVar11;
      *(undefined8 *)(*pauVar8 + 8) = uVar2;
      uVar2 = *(undefined8 *)(pauVar11[1] + 8);
      *(undefined8 *)pauVar8[1] = *(undefined8 *)pauVar11[1];
      *(undefined8 *)(pauVar8[1] + 8) = uVar2;
      uVar2 = *(undefined8 *)(pauVar11[2] + 8);
      *(undefined8 *)pauVar8[2] = *(undefined8 *)pauVar11[2];
      *(undefined8 *)(pauVar8[2] + 8) = uVar2;
      uVar2 = *(undefined8 *)(pauVar11[3] + 8);
      *(undefined8 *)pauVar8[3] = *(undefined8 *)pauVar11[3];
      *(undefined8 *)(pauVar8[3] + 8) = uVar2;
      iVar5 = iVar10 + -4;
      pauVar11 = pauVar11 + 4;
      pauVar8 = pauVar8 + 4;
      bVar1 = 7 < iVar10;
      iVar10 = iVar5;
    } while (bVar1);
  }
  if (1 < iVar5) {
    uVar2 = *(undefined8 *)(*pauVar11 + 8);
    *(undefined8 *)*pauVar8 = *(undefined8 *)*pauVar11;
    *(undefined8 *)(*pauVar8 + 8) = uVar2;
    uVar2 = *(undefined8 *)(pauVar11[1] + 8);
    *(undefined8 *)pauVar8[1] = *(undefined8 *)pauVar11[1];
    *(undefined8 *)(pauVar8[1] + 8) = uVar2;
    iVar5 = iVar5 + -2;
    pauVar11 = pauVar11 + 2;
    pauVar8 = pauVar8 + 2;
  }
  if (iVar5 != 0) {
    uVar2 = *(undefined8 *)(*pauVar11 + 8);
    *(undefined8 *)*pauVar8 = *(undefined8 *)*pauVar11;
    *(undefined8 *)(*pauVar8 + 8) = uVar2;
  }
  if (iVar13 != 0) {
    *(undefined8 *)(local_48[-1] + (long)_Var14._M_pi * 8 + 8) =
         *(undefined8 *)(local_68[-1] + (long)_Var14._M_pi * 8 + 8);
    lVar6 = 0;
    do {
      if (*(long *)(*local_48 + lVar6 * 8) != value) {
        puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar9 = "void test_common(unsigned int, T) [T = long]";
        *(undefined4 *)(puVar9 + 1) = 0x1d;
        *(int *)((long)puVar9 + 0xc) = iVar13;
        __cxa_throw(puVar9,&Exception::typeinfo,0);
      }
      lVar6 = lVar6 + 1;
    } while (iVar13 != (int)lVar6);
  }
  pauVar8 = local_48;
  iVar10 = iVar12;
  iVar5 = iVar13;
  if (3 < iVar12) {
    iVar5 = 7;
    if (iVar12 < 7) {
      iVar5 = iVar12;
    }
    uVar16 = (iVar12 - iVar5) + 3;
    uVar7 = (ulong)(uVar16 >> 2);
    pa.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var14._M_pi;
    memset(local_48,0,uVar7 * 0x40 + 0x40);
    iVar5 = (int)pb.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    iVar10 = (iVar12 - (uVar16 & 0xfffffffc)) + -4;
    pauVar8 = pauVar4 + uVar7 * 4 + 4;
    _Var14._M_pi = pa.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  if (1 < iVar10) {
    iVar10 = iVar10 + -2;
    pauVar8[1] = (undefined1  [16])0x0;
    *pauVar8 = (undefined1  [16])0x0;
    pauVar8 = pauVar8 + 2;
  }
  if (iVar10 != 0) {
    *pauVar8 = (undefined1  [16])0x0;
  }
  if (iVar5 != 0) {
    *(undefined8 *)(pauVar4[-1] + (long)_Var14._M_pi * 8 + 8) = 0;
    lVar6 = 0;
    do {
      if (*(long *)(*pauVar4 + lVar6 * 8) != 0) {
        puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar9 = "void test_common(unsigned int, T) [T = long]";
        *(undefined4 *)(puVar9 + 1) = 0x24;
        *(int *)((long)puVar9 + 0xc) = iVar13;
        __cxa_throw(puVar9,&Exception::typeinfo,0);
      }
      lVar6 = lVar6 + 1;
    } while (iVar13 != (int)lVar6);
    uVar7 = 0;
    do {
      *(ulong *)(*pauVar3 + uVar7 * 8) = uVar7;
      uVar7 = uVar7 + 1;
    } while (uVar15 != uVar7);
  }
  pauVar8 = pauVar4;
  pauVar11 = pauVar3;
  iVar10 = iVar12;
  if (3 < iVar12) {
    do {
      uVar2 = *(undefined8 *)(*pauVar11 + 8);
      *(undefined8 *)*pauVar8 = *(undefined8 *)*pauVar11;
      *(undefined8 *)(*pauVar8 + 8) = uVar2;
      uVar2 = *(undefined8 *)(pauVar11[1] + 8);
      *(undefined8 *)pauVar8[1] = *(undefined8 *)pauVar11[1];
      *(undefined8 *)(pauVar8[1] + 8) = uVar2;
      uVar2 = *(undefined8 *)(pauVar11[2] + 8);
      *(undefined8 *)pauVar8[2] = *(undefined8 *)pauVar11[2];
      *(undefined8 *)(pauVar8[2] + 8) = uVar2;
      uVar2 = *(undefined8 *)(pauVar11[3] + 8);
      *(undefined8 *)pauVar8[3] = *(undefined8 *)pauVar11[3];
      *(undefined8 *)(pauVar8[3] + 8) = uVar2;
      iVar10 = iVar12 + -4;
      pauVar11 = pauVar11 + 4;
      pauVar8 = pauVar8 + 4;
      bVar1 = 7 < iVar12;
      iVar12 = iVar10;
    } while (bVar1);
  }
  if (1 < iVar10) {
    uVar2 = *(undefined8 *)(*pauVar11 + 8);
    *(undefined8 *)*pauVar8 = *(undefined8 *)*pauVar11;
    *(undefined8 *)(*pauVar8 + 8) = uVar2;
    uVar2 = *(undefined8 *)(pauVar11[1] + 8);
    *(undefined8 *)pauVar8[1] = *(undefined8 *)pauVar11[1];
    *(undefined8 *)(pauVar8[1] + 8) = uVar2;
    iVar10 = iVar10 + -2;
    pauVar11 = pauVar11 + 2;
    pauVar8 = pauVar8 + 2;
  }
  if (iVar10 != 0) {
    uVar2 = *(undefined8 *)(*pauVar11 + 8);
    *(undefined8 *)*pauVar8 = *(undefined8 *)*pauVar11;
    *(undefined8 *)(*pauVar8 + 8) = uVar2;
  }
  if (iVar5 != 0) {
    *(undefined8 *)(pauVar4[-1] + (long)_Var14._M_pi * 8 + 8) =
         *(undefined8 *)(pauVar3[-1] + (long)_Var14._M_pi * 8 + 8);
    lVar6 = 0;
    do {
      if (lVar6 != *(long *)(*pauVar4 + lVar6 * 8)) {
        puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar9 = "void test_common(unsigned int, T) [T = long]";
        *(undefined4 *)(puVar9 + 1) = 0x2d;
        *(int *)((long)puVar9 + 0xc) = iVar13;
        __cxa_throw(puVar9,&Exception::typeinfo,0);
      }
      lVar6 = lVar6 + 1;
    } while (iVar13 != (int)lVar6);
  }
  if ((*(long *)(*pauVar3 + uVar15 * 8) == 0x7f) && (*(long *)(*pauVar4 + uVar15 * 8) == 0x3f)) {
    if (pb.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pb.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (pa.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pa.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    return;
  }
  puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar9 = "void test_common(unsigned int, T) [T = long]";
  *(undefined4 *)(puVar9 + 1) = 0x31;
  *(int *)((long)puVar9 + 0xc) = iVar5;
  __cxa_throw(puVar9,&Exception::typeinfo,0);
}

Assistant:

void test_common(unsigned length, T value = 42)
{
    std::shared_ptr<T> pa = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    std::shared_ptr<T> pb = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * a = pa.get();
    T * b = pb.get();
    a[length] = 0x7f;
    b[length] = 0x3f;

    simd::set(value, a, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (a[i] != value)
            FAIL();
    }

    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != value)
            FAIL();
    }

    simd::zero(b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != 0)
            FAIL();
    }

    for (unsigned i=0; i<length; ++i)
        a[i] = i;
    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != (T)i)
            FAIL();
    }

    if (a[length] != 0x7f || b[length] != 0x3f)
        FAIL();
}